

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::AtomicCounterTests::AtomicCounterTests
          (AtomicCounterTests *this,Context *context)

{
  Context *pCVar1;
  _Alloc_hider _Var2;
  TestNode *pTVar3;
  TestNode *pTVar4;
  undefined1 useBranch;
  bool useBranch_00;
  int iVar5;
  ulong uVar6;
  TestSpec *spec_00;
  TestSpec *spec_01;
  TestSpec *spec_02;
  TestSpec *spec_03;
  TestNode *pTVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  Operation operation;
  TestSpec spec;
  string local_240;
  undefined4 local_21c;
  int local_218;
  undefined4 uStack_214;
  int iStack_210;
  uint uStack_20c;
  int local_208;
  undefined4 uStack_204;
  undefined4 local_200;
  int local_1f8;
  int local_1f4;
  ulong local_1f0;
  long local_1e8;
  TestNode *local_1e0;
  TestNode *local_1d8;
  ulong local_1d0;
  TestNode *local_1c8;
  TestNode *local_1c0;
  undefined8 local_1b8;
  TestNode *local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,context->m_testCtx,"atomic_counter","Atomic counter tests");
  (this->super_TestCaseGroup).m_context = context;
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__AtomicCounterTests_00b47c08;
  pTVar3 = (TestNode *)0x0;
  do {
    local_21c = (&DAT_00975850)[(long)pTVar3];
    local_1e8 = CONCAT44(local_1e8._4_4_,local_21c);
    pTVar4 = (TestNode *)0x0;
    local_1d8 = pTVar3;
    do {
      useBranch = SUB81(pTVar3,0);
      iVar9 = (int)pTVar4;
      local_1d0 = CONCAT71(local_1d0._1_7_,iVar9 == 1);
      pTVar3 = (TestNode *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      (anonymous_namespace)::operationToName_abi_cxx11_
                (local_1a8,(_anonymous_namespace_ *)&local_21c,(Operation *)(ulong)(iVar9 == 1),
                 (bool)useBranch);
      _Var2._M_p = local_1a8[0]._M_dataplus._M_p;
      local_1e0 = pTVar4;
      (anonymous_namespace)::operationToDescription_abi_cxx11_
                (&local_240,(_anonymous_namespace_ *)&local_21c,(Operation *)(ulong)(iVar9 == 1),
                 (bool)useBranch);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,_Var2._M_p,local_240._M_dataplus._M_p);
      pTVar7 = local_1e0;
      ((TestNode *)&pTVar3->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
      ((TestNode *)&pTVar3[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      local_1c8 = pTVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      uVar10 = (uint)pTVar7 ^ 1;
      pTVar3 = (TestNode *)0x0;
      local_1b8 = CONCAT44(local_1b8._4_4_,(uint)pTVar7) ^ 1;
      do {
        iVar9 = (&DAT_00975820)[(long)pTVar3];
        uVar6 = 0;
        local_1f8 = iVar9;
        local_1c0 = pTVar3;
        do {
          iVar8 = (&DAT_0097582c)[uVar6];
          lVar11 = 0;
          local_1f4 = iVar8;
          local_1f0 = uVar6;
          do {
            iVar5 = *(int *)((long)&DAT_00975838 + lVar11) * iVar8;
            if ((iVar5 * iVar9 < 0x2711) && (iVar5 != 1 || uVar10 != 0)) {
              uStack_204 = 0;
              local_200 = 0;
              uStack_214 = (undefined4)local_1e8;
              uStack_20c = CONCAT31((int3)(uStack_20c >> 8),(undefined1)local_1d0);
              local_218 = iVar9;
              iStack_210 = iVar8;
              local_208 = *(int *)((long)&DAT_00975838 + lVar11);
              pTVar3 = (TestNode *)operator_new(0x98);
              pCVar1 = (this->super_TestCaseGroup).m_context;
              (anonymous_namespace)::specToTestName_abi_cxx11_
                        (local_1a8,(_anonymous_namespace_ *)&local_218,spec_00);
              _Var2._M_p = local_1a8[0]._M_dataplus._M_p;
              (anonymous_namespace)::specToTestDescription_abi_cxx11_
                        (&local_240,(_anonymous_namespace_ *)&local_218,spec_01);
              tcu::TestCase::TestCase
                        ((TestCase *)pTVar3,pCVar1->m_testCtx,_Var2._M_p,local_240._M_dataplus._M_p)
              ;
              pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
              pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b47c58;
              pTVar3[1].m_testCtx = (TestContext *)CONCAT44(uStack_214,local_218);
              pTVar3[1].m_name._M_dataplus._M_p = (pointer)CONCAT44(uStack_20c,iStack_210);
              *(ulong *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) =
                   CONCAT44(local_208,uStack_20c);
              *(ulong *)((long)&pTVar3[1].m_name._M_string_length + 4) =
                   CONCAT44(local_200,uStack_204);
              tcu::TestNode::addChild(local_1c8,pTVar3);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_240._M_dataplus._M_p != &local_240.field_2) {
                operator_delete(local_240._M_dataplus._M_p,
                                local_240.field_2._M_allocated_capacity + 1);
              }
              pTVar7 = local_1e0;
              uVar10 = (uint)local_1b8;
              iVar9 = local_1f8;
              iVar8 = local_1f4;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
                operator_delete(local_1a8[0]._M_dataplus._M_p,
                                local_1a8[0].field_2._M_allocated_capacity + 1);
                iVar9 = local_1f8;
                iVar8 = local_1f4;
              }
            }
            lVar11 = lVar11 + 4;
          } while (lVar11 != 0xc);
          uVar6 = local_1f0 + 1;
        } while (uVar6 != 3);
        pTVar3 = (TestNode *)((long)&((TestNode *)&local_1c0->_vptr_TestNode)->_vptr_TestNode + 1);
      } while (pTVar3 != (TestNode *)0x3);
      tcu::TestNode::addChild((TestNode *)this,local_1c8);
      pTVar4 = (TestNode *)(ulong)((int)pTVar7 + 1);
    } while ((int)pTVar7 == 0);
    pTVar3 = (TestNode *)((long)&((TestNode *)&local_1d8->_vptr_TestNode)->_vptr_TestNode + 1);
  } while (pTVar3 != (TestNode *)0x7);
  pTVar3 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,"layout","Layout qualifier tests.");
  ((TestNode *)&pTVar3->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  ((TestNode *)&pTVar3[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar1;
  uVar6 = 0;
  local_1b0 = pTVar3;
  do {
    local_1d0 = (ulong)(uint)(&DAT_009766d0)[uVar6];
    local_1d8 = (TestNode *)operator_new(0x78);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    uVar10 = (int)local_1d0 - 1;
    local_1f0 = uVar6;
    if (uVar10 < 6) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,&DAT_009758e4 + *(int *)(&DAT_009758e4 + (ulong)uVar10 * 4),
                 *(long *)(&DAT_00975900 + (ulong)uVar10 * 8));
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    _Var2._M_p = local_240._M_dataplus._M_p;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Test using atomic counters with explicit layout bindings and",
               0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               &DAT_00975930 + *(int *)(&DAT_00975930 + (long)(int)local_1d0 * 4),
               *(long *)(&DAT_00975950 + (long)(int)local_1d0 * 8));
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    pTVar3 = local_1d8;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_1d8,pCVar1->m_testCtx,_Var2._M_p,
               (char *)CONCAT44(uStack_214,local_218));
    ((TestNode *)&pTVar3->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
    ((TestNode *)&pTVar3[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar1;
    if ((int *)CONCAT44(uStack_214,local_218) != &local_208) {
      operator_delete((int *)CONCAT44(uStack_214,local_218),CONCAT44(uStack_204,local_208) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    pTVar3 = (TestNode *)0x0;
    do {
      local_21c = (&DAT_0097586c)[(long)pTVar3];
      local_1c8 = (TestNode *)CONCAT44(local_1c8._4_4_,local_21c);
      local_1c0 = pTVar3;
      local_1e0 = (TestNode *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      useBranch_00 = SUB81(pTVar3,0);
      (anonymous_namespace)::operationToName_abi_cxx11_
                (local_1a8,(_anonymous_namespace_ *)&local_21c,(Operation *)0x0,useBranch_00);
      _Var2._M_p = local_1a8[0]._M_dataplus._M_p;
      (anonymous_namespace)::operationToDescription_abi_cxx11_
                (&local_240,(_anonymous_namespace_ *)&local_21c,(Operation *)0x0,useBranch_00);
      pTVar3 = local_1e0;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_1e0,pCVar1->m_testCtx,_Var2._M_p,local_240._M_dataplus._M_p)
      ;
      pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
      pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      uVar6 = local_1f0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      lVar11 = 0;
      do {
        local_1e8 = lVar11;
        if (((uVar6 != 1 || lVar11 != 0) && (local_1f0 < 2 || lVar11 != 0)) &&
           ((int)lVar11 != 0 || (int)local_1f0 != 0)) {
          local_1f8 = *(int *)(&DAT_009766b8 + lVar11 * 4);
          uVar6 = 0;
          do {
            local_1f4 = (&DAT_009766c0)[uVar6];
            lVar11 = 0;
            local_1b8 = uVar6;
            do {
              local_208 = *(int *)((long)&DAT_009766c8 + lVar11);
              local_200 = 0;
              local_218 = local_1f8;
              uStack_214 = local_1c8._0_4_;
              iStack_210 = local_1f4;
              uStack_20c = uStack_20c & 0xffffff00;
              uStack_204 = (undefined4)local_1d0;
              pTVar4 = (TestNode *)operator_new(0x98);
              pCVar1 = (this->super_TestCaseGroup).m_context;
              (anonymous_namespace)::specToTestName_abi_cxx11_
                        (local_1a8,(_anonymous_namespace_ *)&local_218,spec_02);
              _Var2._M_p = local_1a8[0]._M_dataplus._M_p;
              (anonymous_namespace)::specToTestDescription_abi_cxx11_
                        (&local_240,(_anonymous_namespace_ *)&local_218,spec_03);
              tcu::TestCase::TestCase
                        ((TestCase *)pTVar4,pCVar1->m_testCtx,_Var2._M_p,local_240._M_dataplus._M_p)
              ;
              pTVar3 = local_1e0;
              pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
              pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b47c58;
              pTVar4[1].m_testCtx = (TestContext *)CONCAT44(uStack_214,local_218);
              pTVar4[1].m_name._M_dataplus._M_p = (pointer)CONCAT44(uStack_20c,iStack_210);
              *(ulong *)((long)&pTVar4[1].m_name._M_dataplus._M_p + 4) =
                   CONCAT44(local_208,uStack_20c);
              *(ulong *)((long)&pTVar4[1].m_name._M_string_length + 4) =
                   CONCAT44(local_200,uStack_204);
              tcu::TestNode::addChild(local_1e0,pTVar4);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_240._M_dataplus._M_p != &local_240.field_2) {
                operator_delete(local_240._M_dataplus._M_p,
                                local_240.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
                operator_delete(local_1a8[0]._M_dataplus._M_p,
                                local_1a8[0].field_2._M_allocated_capacity + 1);
              }
              lVar11 = lVar11 + 4;
            } while (lVar11 == 4);
            uVar6 = local_1b8 + 1;
          } while (local_1b8 == 0);
        }
        pTVar4 = local_1d8;
        uVar6 = local_1f0;
        lVar11 = local_1e8 + 1;
      } while (local_1e8 == 0);
      tcu::TestNode::addChild(local_1d8,pTVar3);
      pTVar7 = local_1b0;
      pTVar3 = (TestNode *)((long)&((TestNode *)&local_1c0->_vptr_TestNode)->_vptr_TestNode + 1);
    } while (pTVar3 != (TestNode *)0x3);
    tcu::TestNode::addChild(local_1b0,pTVar4);
    uVar6 = uVar6 + 1;
  } while (uVar6 != 4);
  pTVar3 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,"invalid","Test invalid layouts");
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar4 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pCVar1->m_testCtx,"invalid_binding",
             "Test layout qualifiers with invalid binding.");
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b47c58;
  pTVar4[1].m_testCtx = (TestContext *)0x100000001;
  *(undefined4 *)&pTVar4[1].m_name._M_dataplus._M_p = 1;
  *(undefined1 *)((long)&pTVar4[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar4[1].m_name._M_string_length = 1;
  *(undefined4 *)&pTVar4[1].m_name.field_2 = 1;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pCVar1->m_testCtx,"invalid_default_binding",
             "Test layout qualifiers with invalid default binding.");
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b47c58;
  pTVar4[1].m_testCtx = (TestContext *)0x100000001;
  *(undefined4 *)&pTVar4[1].m_name._M_dataplus._M_p = 1;
  *(undefined1 *)((long)&pTVar4[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar4[1].m_name._M_string_length = 1;
  *(undefined4 *)&pTVar4[1].m_name.field_2 = 2;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pCVar1->m_testCtx,"invalid_offset_align",
             "Test layout qualifiers with invalid alignment offset.");
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b47c58;
  pTVar4[1].m_testCtx = (TestContext *)0x100000001;
  *(undefined4 *)&pTVar4[1].m_name._M_dataplus._M_p = 1;
  *(undefined1 *)((long)&pTVar4[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar4[1].m_name._M_string_length = 0x600000001;
  *(undefined4 *)&pTVar4[1].m_name.field_2 = 0;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pCVar1->m_testCtx,"invalid_offset_overlap",
             "Test layout qualifiers with invalid overlapping offset.");
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b47c58;
  pTVar4[1].m_testCtx = (TestContext *)0x100000002;
  *(undefined4 *)&pTVar4[1].m_name._M_dataplus._M_p = 1;
  *(undefined1 *)((long)&pTVar4[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar4[1].m_name._M_string_length = 0x700000001;
  *(undefined4 *)&pTVar4[1].m_name.field_2 = 0;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pCVar1->m_testCtx,"invalid_default_offset",
             "Test layout qualifiers with invalid default offset.");
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b47c58;
  pTVar4[1].m_testCtx = (TestContext *)0x100000001;
  *(undefined4 *)&pTVar4[1].m_name._M_dataplus._M_p = 1;
  *(undefined1 *)((long)&pTVar4[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar4[1].m_name._M_string_length = 0x800000001;
  *(undefined4 *)&pTVar4[1].m_name.field_2 = 0;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  tcu::TestNode::addChild(pTVar7,pTVar3);
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  return;
}

Assistant:

AtomicCounterTests::AtomicCounterTests (Context& context)
	: TestCaseGroup(context, "atomic_counter", "Atomic counter tests")
{
	// Runtime use tests
	{
		const int counterCounts[] =
		{
			1, 4, 8
		};

		const int callCounts[] =
		{
			1, 5, 100
		};

		const int threadCounts[] =
		{
			1, 10, 5000
		};

		const AtomicCounterTest::Operation operations[] =
		{
			AtomicCounterTest::OPERATION_GET,
			AtomicCounterTest::OPERATION_INC,
			AtomicCounterTest::OPERATION_DEC,

			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_INC|AtomicCounterTest::OPERATION_GET),
			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_DEC|AtomicCounterTest::OPERATION_GET),

			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_INC|AtomicCounterTest::OPERATION_DEC),
			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_INC|AtomicCounterTest::OPERATION_DEC|AtomicCounterTest::OPERATION_GET)
		};

		for (int operationNdx = 0; operationNdx < DE_LENGTH_OF_ARRAY(operations); operationNdx++)
		{
			const AtomicCounterTest::Operation operation = operations[operationNdx];

			for (int branch = 0; branch < 2; branch++)
			{
				const bool useBranch = (branch == 1);

				TestCaseGroup* operationGroup = new TestCaseGroup(m_context, operationToName(operation, useBranch).c_str(), operationToDescription(operation, useBranch).c_str());

				for (int counterCountNdx = 0; counterCountNdx < DE_LENGTH_OF_ARRAY(counterCounts); counterCountNdx++)
				{
					const int counterCount = counterCounts[counterCountNdx];

					for (int callCountNdx = 0; callCountNdx < DE_LENGTH_OF_ARRAY(callCounts); callCountNdx++)
					{
						const int callCount = callCounts[callCountNdx];

						for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
						{
							const int threadCount = threadCounts[threadCountNdx];

							if (threadCount * callCount * counterCount > 10000)
								continue;

							if (useBranch && threadCount * callCount == 1)
								continue;

							AtomicCounterTest::TestSpec spec;

							spec.atomicCounterCount = counterCount;
							spec.operations			= operation;
							spec.callCount			= callCount;
							spec.useBranches		= useBranch;
							spec.threadCount		= threadCount;
							spec.bindingType		= AtomicCounterTest::BINDINGTYPE_BASIC;
							spec.offsetType			= AtomicCounterTest::OFFSETTYPE_NONE;

							operationGroup->addChild(new AtomicCounterTest(m_context, specToTestName(spec).c_str(), specToTestDescription(spec).c_str(), spec));
						}
					}
				}

				addChild(operationGroup);
			}
		}
	}

	{
		TestCaseGroup* layoutGroup = new TestCaseGroup(m_context, "layout", "Layout qualifier tests.");

		const int counterCounts[]	= { 1, 8 };
		const int callCounts[]		= { 1, 5 };
		const int threadCounts[]	= { 1, 1000 };

		const AtomicCounterTest::Operation operations[] =
		{
			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_INC|AtomicCounterTest::OPERATION_GET),
			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_DEC|AtomicCounterTest::OPERATION_GET),
			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_INC|AtomicCounterTest::OPERATION_DEC)
		};

		const AtomicCounterTest::OffsetType offsetTypes[] =
		{
			AtomicCounterTest::OFFSETTYPE_REVERSE,
			AtomicCounterTest::OFFSETTYPE_FIRST_AUTO,
			AtomicCounterTest::OFFSETTYPE_DEFAULT_AUTO,
			AtomicCounterTest::OFFSETTYPE_RESET_DEFAULT
		};

		for (int offsetTypeNdx = 0; offsetTypeNdx < DE_LENGTH_OF_ARRAY(offsetTypes); offsetTypeNdx++)
		{
			const AtomicCounterTest::OffsetType offsetType = offsetTypes[offsetTypeNdx];

			TestCaseGroup* layoutQualifierGroup = new TestCaseGroup(m_context, layoutTypesToName(AtomicCounterTest::BINDINGTYPE_BASIC, offsetType).c_str(), layoutTypesToDesc(AtomicCounterTest::BINDINGTYPE_BASIC, offsetType).c_str());

			for (int operationNdx = 0; operationNdx < DE_LENGTH_OF_ARRAY(operations); operationNdx++)
			{
				const AtomicCounterTest::Operation operation = operations[operationNdx];

				TestCaseGroup* operationGroup = new TestCaseGroup(m_context, operationToName(operation, false).c_str(), operationToDescription(operation, false).c_str());

				for (int counterCountNdx = 0; counterCountNdx < DE_LENGTH_OF_ARRAY(counterCounts); counterCountNdx++)
				{
					const int counterCount = counterCounts[counterCountNdx];

					if (offsetType == AtomicCounterTest::OFFSETTYPE_FIRST_AUTO && counterCount < 3)
						continue;

					if (offsetType == AtomicCounterTest::OFFSETTYPE_DEFAULT_AUTO && counterCount < 2)
						continue;

					if (offsetType == AtomicCounterTest::OFFSETTYPE_RESET_DEFAULT && counterCount < 2)
						continue;

					if (offsetType == AtomicCounterTest::OFFSETTYPE_REVERSE && counterCount < 2)
						continue;

					for (int callCountNdx = 0; callCountNdx < DE_LENGTH_OF_ARRAY(callCounts); callCountNdx++)
					{
						const int callCount = callCounts[callCountNdx];

						for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
						{
							const int threadCount = threadCounts[threadCountNdx];

							AtomicCounterTest::TestSpec spec;

							spec.atomicCounterCount = counterCount;
							spec.operations			= operation;
							spec.callCount			= callCount;
							spec.useBranches		= false;
							spec.threadCount		= threadCount;
							spec.bindingType		= AtomicCounterTest::BINDINGTYPE_BASIC;
							spec.offsetType			= offsetType;

							operationGroup->addChild(new AtomicCounterTest(m_context, specToTestName(spec).c_str(), specToTestDescription(spec).c_str(), spec));
						}
					}
				}
				layoutQualifierGroup->addChild(operationGroup);
			}
			layoutGroup->addChild(layoutQualifierGroup);
		}

		{
			TestCaseGroup* invalidGroup = new TestCaseGroup(m_context, "invalid", "Test invalid layouts");

			{
				AtomicCounterTest::TestSpec spec;

				spec.atomicCounterCount = 1;
				spec.operations			= AtomicCounterTest::OPERATION_INC;
				spec.callCount			= 1;
				spec.useBranches		= false;
				spec.threadCount		= 1;
				spec.bindingType		= AtomicCounterTest::BINDINGTYPE_INVALID;
				spec.offsetType			= AtomicCounterTest::OFFSETTYPE_NONE;

				invalidGroup->addChild(new AtomicCounterTest(m_context, "invalid_binding", "Test layout qualifiers with invalid binding.", spec));
			}

			{
				AtomicCounterTest::TestSpec spec;

				spec.atomicCounterCount = 1;
				spec.operations			= AtomicCounterTest::OPERATION_INC;
				spec.callCount			= 1;
				spec.useBranches		= false;
				spec.threadCount		= 1;
				spec.bindingType		= AtomicCounterTest::BINDINGTYPE_INVALID_DEFAULT;
				spec.offsetType			= AtomicCounterTest::OFFSETTYPE_NONE;

				invalidGroup->addChild(new AtomicCounterTest(m_context, "invalid_default_binding", "Test layout qualifiers with invalid default binding.", spec));
			}

			{
				AtomicCounterTest::TestSpec spec;

				spec.atomicCounterCount = 1;
				spec.operations			= AtomicCounterTest::OPERATION_INC;
				spec.callCount			= 1;
				spec.useBranches		= false;
				spec.threadCount		= 1;
				spec.bindingType		= AtomicCounterTest::BINDINGTYPE_BASIC;
				spec.offsetType			= AtomicCounterTest::OFFSETTYPE_INVALID;

				invalidGroup->addChild(new AtomicCounterTest(m_context, "invalid_offset_align", "Test layout qualifiers with invalid alignment offset.", spec));
			}

			{
				AtomicCounterTest::TestSpec spec;

				spec.atomicCounterCount = 2;
				spec.operations			= AtomicCounterTest::OPERATION_INC;
				spec.callCount			= 1;
				spec.useBranches		= false;
				spec.threadCount		= 1;
				spec.bindingType		= AtomicCounterTest::BINDINGTYPE_BASIC;
				spec.offsetType			= AtomicCounterTest::OFFSETTYPE_INVALID_OVERLAPPING;

				invalidGroup->addChild(new AtomicCounterTest(m_context, "invalid_offset_overlap", "Test layout qualifiers with invalid overlapping offset.", spec));
			}

			{
				AtomicCounterTest::TestSpec spec;

				spec.atomicCounterCount = 1;
				spec.operations			= AtomicCounterTest::OPERATION_INC;
				spec.callCount			= 1;
				spec.useBranches		= false;
				spec.threadCount		= 1;
				spec.bindingType		= AtomicCounterTest::BINDINGTYPE_BASIC;
				spec.offsetType			= AtomicCounterTest::OFFSETTYPE_INVALID_DEFAULT;

				invalidGroup->addChild(new AtomicCounterTest(m_context, "invalid_default_offset", "Test layout qualifiers with invalid default offset.", spec));
			}

			layoutGroup->addChild(invalidGroup);
		}

		addChild(layoutGroup);
	}
}